

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

void __thiscall
cfd::core::DescriptorScriptReference::DescriptorScriptReference
          (DescriptorScriptReference *this,DescriptorScriptReference *object)

{
  Script::Script(&this->locking_script_);
  Script::Script(&this->redeem_script_);
  core::Address::Address(&this->address_script_);
  TapBranch::TapBranch(&this->tapbranch_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  (this->addr_prefixes_).
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->addr_prefixes_).
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->keys_).
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->addr_prefixes_).
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keys_).
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keys_).
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->child_script_).
  super___shared_ptr<cfd::core::DescriptorScriptReference,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->child_script_).
  super___shared_ptr<cfd::core::DescriptorScriptReference,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Script::operator=(&this->locking_script_,&object->locking_script_);
  this->script_type_ = object->script_type_;
  core::Address::operator=(&this->address_script_,&object->address_script_);
  this->is_script_ = object->is_script_;
  Script::operator=(&this->redeem_script_,&object->redeem_script_);
  (this->child_script_).
  super___shared_ptr<cfd::core::DescriptorScriptReference,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (object->child_script_).
       super___shared_ptr<cfd::core::DescriptorScriptReference,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->child_script_).
              super___shared_ptr<cfd::core::DescriptorScriptReference,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(object->child_script_).
              super___shared_ptr<cfd::core::DescriptorScriptReference,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  operator=(&this->keys_,&object->keys_);
  this->req_num_ = object->req_num_;
  TapBranch::operator=(&this->tapbranch_,&object->tapbranch_);
  this->is_tapbranch_ = object->is_tapbranch_;
  TaprootScriptTree::operator=(&this->script_tree_,&object->script_tree_);
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  operator=(&this->addr_prefixes_,&object->addr_prefixes_);
  return;
}

Assistant:

DescriptorScriptReference::DescriptorScriptReference(
    const DescriptorScriptReference& object) {
  locking_script_ = object.locking_script_;
  script_type_ = object.script_type_;
  address_script_ = object.address_script_;
  is_script_ = object.is_script_;
  redeem_script_ = object.redeem_script_;
  child_script_ = object.child_script_;
  keys_ = object.keys_;
  req_num_ = object.req_num_;
  tapbranch_ = object.tapbranch_;
  is_tapbranch_ = object.is_tapbranch_;
  script_tree_ = object.script_tree_;
  addr_prefixes_ = object.addr_prefixes_;
}